

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_sizeof_matchState
                 (ZSTD_compressionParameters *cParams,ZSTD_paramSwitch_e useRowMatchFinder,
                 U32 enableDedicatedDictSearch,U32 forCCtx)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  int in_ECX;
  int in_ESI;
  uint *in_RDI;
  size_t slackSpace;
  size_t optSpace;
  size_t lazyAdditionalSpace;
  size_t optPotentialSpace;
  size_t tableSpace;
  size_t h3Size;
  U32 hashLog3;
  size_t hSize;
  size_t chainSize;
  U32 in_stack_ffffffffffffff3c;
  undefined8 in_stack_ffffffffffffff40;
  size_t local_b8;
  long local_88;
  uint local_80;
  uint local_7c;
  long local_78;
  
  iVar2 = ZSTD_allocateChainTable
                    ((ZSTD_strategy)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                     (ZSTD_paramSwitch_e)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  if (iVar2 == 0) {
    local_78 = 0;
  }
  else {
    local_78 = 1L << ((byte)in_RDI[1] & 0x3f);
  }
  uVar1 = in_RDI[2];
  if ((in_ECX == 0) || (in_RDI[4] != 3)) {
    local_80 = 0;
  }
  else {
    if (*in_RDI < 0x12) {
      local_7c = *in_RDI;
    }
    else {
      local_7c = 0x11;
    }
    local_80 = local_7c;
  }
  if (local_80 == 0) {
    local_88 = 0;
  }
  else {
    local_88 = 1L << ((byte)local_80 & 0x3f);
  }
  sVar3 = ZSTD_cwksp_aligned_alloc_size(0x23be2c);
  sVar4 = ZSTD_cwksp_aligned_alloc_size(0x23be3b);
  sVar5 = ZSTD_cwksp_aligned_alloc_size(0x23be55);
  sVar6 = ZSTD_cwksp_aligned_alloc_size(0x23be6f);
  sVar7 = ZSTD_cwksp_aligned_alloc_size(0x23be89);
  sVar8 = ZSTD_cwksp_aligned_alloc_size(0x23bea3);
  lVar9 = sVar3 + sVar4 + sVar5 + sVar6 + sVar7 + sVar8;
  iVar2 = ZSTD_rowMatchFinderUsed
                    ((ZSTD_strategy)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                     (ZSTD_paramSwitch_e)in_stack_ffffffffffffff40);
  if (iVar2 == 0) {
    local_b8 = 0;
  }
  else {
    local_b8 = ZSTD_cwksp_aligned_alloc_size(0x23bedf);
  }
  if ((in_ECX == 0) || (in_RDI[6] < 7)) {
    lVar9 = 0;
  }
  sVar3 = ZSTD_cwksp_slack_space_required();
  if (in_ESI != 0) {
    return local_78 * 4 + (1L << ((byte)uVar1 & 0x3f)) * 4 + local_88 * 4 + lVar9 + sVar3 + local_b8
    ;
  }
  __assert_fail("useRowMatchFinder != ZSTD_ps_auto",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x5719,
                "size_t ZSTD_sizeof_matchState(const ZSTD_compressionParameters *const, const ZSTD_paramSwitch_e, const U32, const U32)"
               );
}

Assistant:

static size_t
ZSTD_sizeof_matchState(const ZSTD_compressionParameters* const cParams,
                       const ZSTD_paramSwitch_e useRowMatchFinder,
                       const U32 enableDedicatedDictSearch,
                       const U32 forCCtx)
{
    /* chain table size should be 0 for fast or row-hash strategies */
    size_t const chainSize = ZSTD_allocateChainTable(cParams->strategy, useRowMatchFinder, enableDedicatedDictSearch && !forCCtx)
                                ? ((size_t)1 << cParams->chainLog)
                                : 0;
    size_t const hSize = ((size_t)1) << cParams->hashLog;
    U32    const hashLog3 = (forCCtx && cParams->minMatch==3) ? MIN(ZSTD_HASHLOG3_MAX, cParams->windowLog) : 0;
    size_t const h3Size = hashLog3 ? ((size_t)1) << hashLog3 : 0;
    /* We don't use ZSTD_cwksp_alloc_size() here because the tables aren't
     * surrounded by redzones in ASAN. */
    size_t const tableSpace = chainSize * sizeof(U32)
                            + hSize * sizeof(U32)
                            + h3Size * sizeof(U32);
    size_t const optPotentialSpace =
        ZSTD_cwksp_aligned_alloc_size((MaxML+1) * sizeof(U32))
      + ZSTD_cwksp_aligned_alloc_size((MaxLL+1) * sizeof(U32))
      + ZSTD_cwksp_aligned_alloc_size((MaxOff+1) * sizeof(U32))
      + ZSTD_cwksp_aligned_alloc_size((1<<Litbits) * sizeof(U32))
      + ZSTD_cwksp_aligned_alloc_size((ZSTD_OPT_NUM+1) * sizeof(ZSTD_match_t))
      + ZSTD_cwksp_aligned_alloc_size((ZSTD_OPT_NUM+1) * sizeof(ZSTD_optimal_t));
    size_t const lazyAdditionalSpace = ZSTD_rowMatchFinderUsed(cParams->strategy, useRowMatchFinder)
                                            ? ZSTD_cwksp_aligned_alloc_size(hSize)
                                            : 0;
    size_t const optSpace = (forCCtx && (cParams->strategy >= ZSTD_btopt))
                                ? optPotentialSpace
                                : 0;
    size_t const slackSpace = ZSTD_cwksp_slack_space_required();

    /* tables are guaranteed to be sized in multiples of 64 bytes (or 16 uint32_t) */
    ZSTD_STATIC_ASSERT(ZSTD_HASHLOG_MIN >= 4 && ZSTD_WINDOWLOG_MIN >= 4 && ZSTD_CHAINLOG_MIN >= 4);
    assert(useRowMatchFinder != ZSTD_ps_auto);

    DEBUGLOG(4, "chainSize: %u - hSize: %u - h3Size: %u",
                (U32)chainSize, (U32)hSize, (U32)h3Size);
    return tableSpace + optSpace + slackSpace + lazyAdditionalSpace;
}